

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.h
# Opt level: O1

HighsStatus returnFromSolveLpSimplex(HighsLpSolverObject *solver_object,HighsStatus return_status)

{
  HighsOptions *pHVar1;
  HEkk *this;
  HighsLp *lp;
  HighsInfo *pHVar2;
  HighsDebugStatus HVar3;
  string local_50;
  
  pHVar1 = solver_object->options_;
  this = solver_object->ekk_instance_;
  lp = solver_object->lp_;
  (solver_object->highs_info_->super_HighsInfoStruct).simplex_iteration_count =
       this->iteration_count_;
  if (return_status == kError) {
    HEkk::clear(this);
    return_status = kError;
  }
  else {
    HEkk::setNlaPointersForLpAndScale(this,lp);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"HApp: returnFromSolveLpSimplex","");
    HVar3 = HEkk::debugNlaCheckInvert(this,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (HVar3 == kError) {
      highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                   "Error in basis matrix inverse after solving the LP\n");
      return_status = kError;
    }
    if (solver_object->model_status_ == kOptimal) {
      pHVar2 = solver_object->highs_info_;
      (pHVar2->super_HighsInfoStruct).max_complementarity_violation = 0.0;
      (pHVar2->super_HighsInfoStruct).sum_complementarity_violations = 0.0;
    }
  }
  return return_status;
}

Assistant:

inline HighsStatus returnFromSolveLpSimplex(HighsLpSolverObject& solver_object,
                                            HighsStatus return_status) {
  HighsOptions& options = solver_object.options_;
  HEkk& ekk_instance = solver_object.ekk_instance_;
  HighsLp& incumbent_lp = solver_object.lp_;
  // Copy the simplex iteration count to highs_info_ from ekk_instance
  solver_object.highs_info_.simplex_iteration_count =
      ekk_instance.iteration_count_;
  // Ensure that the incumbent LP is neither moved, nor scaled
  assert(!incumbent_lp.is_moved_);
  assert(!incumbent_lp.is_scaled_);
  // Cannot expect any more with an error return, and safer to clear
  // HEkk than try to retain any data
  if (return_status == HighsStatus::kError) {
    ekk_instance.clear();
    return return_status;
  }
  //
  // Ensure that there is an invert for the current LP
  assert(ekk_instance.status_.has_invert);
  // Ensure that simplex NLA is set up
  assert(ekk_instance.status_.has_nla);
  // Set the simplex NLA scaling
  ekk_instance.setNlaPointersForLpAndScale(incumbent_lp);
  assert(ekk_instance.debugNlaScalingOk(incumbent_lp));
  HighsInt alt_debug_level = -1;
  // Forced expensive debug for development work
  //  alt_debug_level = kHighsDebugLevelExpensive;
  if (ekk_instance.debugNlaCheckInvert("HApp: returnFromSolveLpSimplex",
                                       alt_debug_level) ==
      HighsDebugStatus::kError) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Error in basis matrix inverse after solving the LP\n");
    return_status = HighsStatus::kError;
  }
  if (solver_object.model_status_ == HighsModelStatus::kOptimal) {
    solver_object.highs_info_.max_complementarity_violation = 0;
    solver_object.highs_info_.sum_complementarity_violations = 0;
  }
  return return_status;
}